

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O1

uint32 leaf_mixw_occ(dtree_node_t *node,pset_t *pset,float32 ****mixw_occ,uint32 *node_id,
                    uint32 n_state,uint32 n_stream,uint32 n_density,uint32 off)

{
  float32 *pfVar1;
  float32 *pfVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  for (; (node->y != (dtree_node_t *)0x0 || (node->n != (dtree_node_str *)0x0)); node = node->n) {
    off = leaf_mixw_occ(node->y,pset,mixw_occ,node_id,n_state,n_stream,n_density,off);
  }
  node_id[off] = node->node_id;
  if (n_state != 0) {
    uVar3 = 0;
    do {
      if (n_stream != 0) {
        uVar4 = 0;
        do {
          if (n_density != 0) {
            pfVar1 = node->mixw_occ[uVar3][uVar4];
            pfVar2 = mixw_occ[off][uVar3][uVar4];
            uVar5 = 0;
            do {
              pfVar2[uVar5] = pfVar1[uVar5];
              uVar5 = uVar5 + 1;
            } while (n_density != uVar5);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != n_stream);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != n_state);
  }
  return off + 1;
}

Assistant:

uint32
leaf_mixw_occ(dtree_node_t *node,
	      pset_t *pset,
	      float32 ****mixw_occ,
	      uint32 *node_id,
	      uint32 n_state,
	      uint32 n_stream,
	      uint32 n_density,
	      uint32 off)
{
    uint32 i, j, k;

    if (IS_LEAF(node)) {
	node_id[off] = node->node_id;

	for (i = 0; i < n_state; i++) {
	    for (j = 0; j < n_stream; j++) {
		for (k = 0; k < n_density; k++) {
		    mixw_occ[off][i][j][k] = node->mixw_occ[i][j][k];
		}
	    }
	}

	return ++off;
    }
    else {
	off = leaf_mixw_occ(node->y,
			pset,
			mixw_occ,
			node_id,
			n_state,
			n_stream,
			n_density,
			off);
	off = leaf_mixw_occ(node->n,
			pset,
			mixw_occ,
			node_id,
			n_state,
			n_stream,
			n_density,
			off);
	return off;
    }
}